

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::PrimitiveSymbol::serializeTo(PrimitiveSymbol *this,ASTSerializer *serializer)

{
  size_t sVar1;
  long lVar2;
  char *pcVar3;
  string_view name;
  
  ASTSerializer::write(serializer,0xc,"isSequential",(ulong)this->isSequential);
  if (this->initVal != (ConstantValue *)0x0) {
    ASTSerializer::write(serializer,7,"initVal",(size_t)this->initVal);
  }
  if ((this->table)._M_extent._M_extent_value != 0) {
    name._M_str = "table";
    name._M_len = 5;
    ASTSerializer::startArray(serializer,name);
    sVar1 = (this->table)._M_extent._M_extent_value;
    if (sVar1 != 0) {
      pcVar3 = &((this->table)._M_ptr)->state;
      lVar2 = sVar1 * 0x18;
      do {
        ASTSerializer::startObject(serializer);
        ASTSerializer::write
                  (serializer,6,"inputs",(((TableEntry *)(pcVar3 + -0x10))->inputs)._M_len);
        if (*pcVar3 != '\0') {
          ASTSerializer::write(serializer,5,"state",1);
        }
        ASTSerializer::write(serializer,6,"output",1);
        ASTSerializer::endObject(serializer);
        pcVar3 = pcVar3 + 0x18;
        lVar2 = lVar2 + -0x18;
      } while (lVar2 != 0);
    }
    ASTSerializer::endArray(serializer);
    return;
  }
  return;
}

Assistant:

void PrimitiveSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("isSequential", isSequential);
    if (initVal)
        serializer.write("initVal", *initVal);

    if (!table.empty()) {
        serializer.startArray("table");
        for (auto& row : table) {
            serializer.startObject();
            serializer.write("inputs", row.inputs);
            if (row.state)
                serializer.write("state", std::string_view(&row.state, 1));
            serializer.write("output", std::string_view(&row.output, 1));
            serializer.endObject();
        }
        serializer.endArray();
    }
}